

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::DefinitionSymbol::ParameterDecl::ParameterDecl
          (ParameterDecl *this,Scope *scope,ParameterDeclarationSyntax *syntax,
          DeclaratorSyntax *decl,bool isLocal,bool isPort,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes)

{
  SourceLocation location;
  DiagCode DVar1;
  DiagCode code;
  string_view sVar2;
  
  (this->field_0).valueSyntax = syntax;
  (this->field_1).valueDecl = decl;
  (this->name)._M_len = 0;
  (this->name)._M_str = (char *)0x0;
  this->location = (SourceLocation)0x0;
  (this->attributes)._M_ptr = attributes._M_ptr;
  (this->attributes)._M_extent._M_extent_value = attributes._M_extent._M_extent_value;
  this->isTypeParam = false;
  this->isLocalParam = isLocal;
  this->isPortParam = isPort;
  this->hasSyntax = true;
  sVar2 = parsing::Token::valueText(&decl->name);
  this->name = sVar2;
  location = parsing::Token::location(&decl->name);
  this->location = location;
  if ((!isPort || isLocal) && decl->initializer == (EqualsValueClauseSyntax *)0x0) {
    DVar1.subsystem = Declarations;
    DVar1.code = 0x6a;
    code.subsystem = Declarations;
    code.code = 0xe;
    if (isPort) {
      code = DVar1;
    }
    Scope::addDiag(scope,code,location);
    return;
  }
  return;
}

Assistant:

DefinitionSymbol::ParameterDecl::ParameterDecl(
    const Scope& scope, const ParameterDeclarationSyntax& syntax, const DeclaratorSyntax& decl,
    bool isLocal, bool isPort, std::span<const syntax::AttributeInstanceSyntax* const> attributes) :
    valueSyntax(&syntax), valueDecl(&decl), attributes(attributes), isTypeParam(false),
    isLocalParam(isLocal), isPortParam(isPort), hasSyntax(true) {

    name = decl.name.valueText();
    location = decl.name.location();

    if (!decl.initializer) {
        if (!isPort)
            scope.addDiag(diag::BodyParamNoInitializer, location);
        else if (isLocal)
            scope.addDiag(diag::LocalParamNoInitializer, location);
    }
}